

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O2

void cleanup_buffer_queue(list_head *q,_Bool destroy)

{
  list_head *plVar1;
  list_head *plVar2;
  list_head *__mptr;
  list_head *plVar3;
  uint uVar4;
  
  uVar4 = 0;
  plVar3 = q->next;
  while (plVar3 != q) {
    plVar1 = plVar3->next;
    plVar2 = plVar3->prev;
    plVar1->prev = plVar2;
    plVar2->next = plVar1;
    plVar3->next = (list_head *)0x100100;
    plVar3->prev = (list_head *)0x200200;
    if (destroy) {
      aura_buffer_destroy((aura_buffer *)(plVar3 + -2));
    }
    else {
      aura_buffer_release((aura_buffer *)(plVar3 + -2));
    }
    uVar4 = uVar4 + 1;
    plVar3 = plVar1;
  }
  slog(6,1,"Cleaned up %d buffers",(ulong)uVar4);
  return;
}

Assistant:

static void cleanup_buffer_queue(struct list_head *q, bool destroy)
{
	int i = 0;

	struct list_head *pos, *tmp;

	list_for_each_safe(pos, tmp, q) {
		struct aura_buffer *b;

		b = list_entry(pos, struct aura_buffer, qentry);
		list_del(pos);
		if (!destroy)   /* Just return it to the pool */
			aura_buffer_release(b);
		else            /* Nuke it, we're closing down anyway*/
			aura_buffer_destroy(b);
		i++;
	}
	slog(6, SLOG_LIVE, "Cleaned up %d buffers", i);
}